

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crc32.cpp
# Opt level: O0

void __thiscall Crc32_Empty_Test::TestBody(Crc32_Empty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  span<char,__1L> buf;
  AssertHelper local_68;
  Message local_60 [3];
  uint local_44;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  uint32_t local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  char empty;
  Crc32_Empty_Test *this_local;
  
  pcVar2 = (char *)((long)&gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7);
  local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::make_span<char>(pcVar2,pcVar2);
  buf.storage_.data_ = (index_type)local_40.data_;
  buf.storage_.super_extent_type<_1L>.size_ = buf.storage_.data_;
  local_2c = pstore::crc32<pstore::gsl::span<char,_1l>>
                       ((pstore *)local_40.super_extent_type<_1L>.size_,buf);
  local_44 = 0xffffffff;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_28,"pstore::crc32 (pstore::gsl::make_span (&empty, &empty))","~0U",
             &local_2c,&local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_crc32.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST (Crc32, Empty) {
    char empty;
    EXPECT_EQ (pstore::crc32 (pstore::gsl::make_span (&empty, &empty)), ~0U);
}